

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<wchar_t>::~NFA(NFA<wchar_t> *this)

{
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_0019f8f8;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::~vector(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  operator_delete(this);
  return;
}

Assistant:

bool epsilon_closure_sub(std::set<int>& closure, int index) const
    {
        //Always include myself
        closure.insert(index);

        bool long_flag = false;
        IndexVector et = m_states[index].epsilon_transitions(long_flag);

        for (int dest : et)
        {
            long_flag |= epsilon_closure_sub(closure, dest);
        }
        return long_flag;
    }